

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O3

_Bool file_stdio_fflush(ALLEGRO_FILE *f)

{
  int errnum;
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  
  puVar2 = (undefined8 *)al_get_file_userdata(f);
  iVar1 = fflush((FILE *)*puVar2);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    errnum = *piVar3;
    *(int *)(puVar2 + 1) = errnum;
    al_set_errno(errnum);
  }
  return iVar1 != -1;
}

Assistant:

static bool file_stdio_fflush(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);

   if (fflush(userdata->fp) == EOF) {
      userdata->errnum = errno;
      al_set_errno(errno);
      return false;
   }

   return true;
}